

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O2

SpatialBinSplit<16UL> * __thiscall
embree::sse2::SpatialBinInfo<16UL,_embree::PrimRef>::best
          (SpatialBinSplit<16UL> *__return_storage_ptr__,SpatialBinInfo<16UL,_embree::PrimRef> *this
          ,SpatialBinMapping<16UL> *mapping,size_t blocks_shift)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar21;
  uint uVar22;
  undefined1 auVar20 [16];
  uint uVar23;
  uint uVar24;
  uint uVar26;
  uint uVar27;
  undefined1 auVar25 [16];
  uint uVar28;
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar32;
  uint uVar33;
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined4 uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  vfloat4 rAreas [16];
  vuint4 rCounts [16];
  undefined8 uStack_908;
  float afStack_900 [62];
  int aiStack_808 [4];
  float afStack_7f8 [64];
  uint auStack_6f8 [284];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  uint local_248 [3];
  int aiStack_23c [4];
  int iStack_22c;
  float local_228;
  uint uStack_224;
  uint uStack_220;
  float local_218 [8];
  float afStack_1f8 [64];
  uint auStack_f8 [50];
  int aiStack_30 [12];
  
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  lVar12 = 0x7f0;
  auVar17 = _DAT_01f45a40;
  auVar18 = _DAT_01f45a30;
  auVar20 = _DAT_01f45a30;
  auVar25 = _DAT_01f45a40;
  auVar29 = _DAT_01f45a30;
  auVar31 = _DAT_01f45a40;
  for (lVar10 = 0x5f0; lVar10 != 0x50; lVar10 = lVar10 + -0x60) {
    piVar1 = (int *)((long)&this->bounds[0][0].lower.field_0 + lVar12);
    iVar13 = iVar13 + *piVar1;
    iVar14 = iVar14 + piVar1[1];
    iVar15 = iVar15 + piVar1[2];
    iVar16 = iVar16 + piVar1[3];
    *(int *)((long)aiStack_808 + lVar12) = iVar13;
    *(int *)((long)aiStack_808 + lVar12 + 4) = iVar14;
    *(int *)((long)aiStack_808 + lVar12 + 8) = iVar15;
    *(int *)((long)aiStack_808 + lVar12 + 0xc) = iVar16;
    auVar29 = minps(auVar29,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar10));
    auVar31 = maxps(auVar31,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar10));
    fVar34 = auVar31._4_4_ - auVar29._4_4_;
    fVar35 = auVar31._8_4_ - auVar29._8_4_;
    auVar20 = minps(auVar20,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar10));
    auVar25 = maxps(auVar25,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar10));
    fVar36 = auVar25._4_4_ - auVar20._4_4_;
    fVar37 = auVar25._8_4_ - auVar20._8_4_;
    *(ulong *)((long)&uStack_908 + lVar12) =
         CONCAT44((auVar25._0_4_ - auVar20._0_4_) * (fVar36 + fVar37) + fVar37 * fVar36,
                  (auVar31._0_4_ - auVar29._0_4_) * (fVar34 + fVar35) + fVar35 * fVar34);
    auVar18 = minps(auVar18,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar10));
    auVar17 = maxps(auVar17,*(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar10)
                   );
    fVar34 = auVar17._4_4_ - auVar18._4_4_;
    fVar35 = auVar17._8_4_ - auVar18._8_4_;
    *(float *)((long)afStack_900 + lVar12) =
         (fVar34 + fVar35) * (auVar17._0_4_ - auVar18._0_4_) + fVar35 * fVar34;
    *(undefined4 *)((long)afStack_900 + lVar12 + 4) = 0;
    lVar12 = lVar12 + -0x10;
  }
  iVar13 = -1;
  uVar11 = ~(-1 << ((byte)blocks_shift & 0x1f));
  uVar30 = 1;
  uVar32 = 1;
  uVar33 = 1;
  local_218[0] = (float)DAT_01f45a30;
  local_218[1] = DAT_01f45a30._4_4_;
  local_218[2] = DAT_01f45a30._8_4_;
  uVar38 = DAT_01f45a30._12_4_;
  aiStack_23c[1] = 0;
  aiStack_23c[2] = 0;
  aiStack_23c[3] = 0;
  local_248[0] = 0;
  local_248[1] = 0;
  local_248[2] = 0;
  lVar12 = 0x600;
  local_228 = 0.0;
  uStack_224 = 0;
  uStack_220 = 0;
  local_278 = _DAT_01f45a30;
  local_288 = _DAT_01f45a30;
  local_268 = _DAT_01f45a40;
  uVar40 = 0;
  uVar41 = 0;
  uVar42 = 0;
  iVar14 = 0;
  auVar17 = _DAT_01f45a40;
  auVar18 = _DAT_01f45a30;
  auVar20 = _DAT_01f45a40;
  for (lVar10 = 0x50; lVar10 != 0x5f0; lVar10 = lVar10 + 0x60) {
    auVar18 = minps(auVar18,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar10));
    auVar20 = maxps(auVar20,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar10));
    local_288 = minps(local_288,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar10));
    auVar17 = maxps(auVar17,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar10));
    fVar34 = auVar20._4_4_ - auVar18._4_4_;
    fVar35 = auVar20._8_4_ - auVar18._8_4_;
    local_278 = minps(local_278,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar10));
    fVar36 = auVar17._4_4_ - local_288._4_4_;
    fVar37 = auVar17._8_4_ - local_288._8_4_;
    local_268 = maxps(local_268,
                      *(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar10));
    fVar43 = local_268._0_4_ - local_278._0_4_;
    fVar44 = local_268._4_4_ - local_278._4_4_;
    fVar45 = local_268._8_4_ - local_278._8_4_;
    piVar1 = (int *)((long)&this->bounds[0][0].lower.field_0 + lVar12);
    uVar40 = uVar40 + *piVar1;
    uVar41 = uVar41 + piVar1[1];
    uVar42 = uVar42 + piVar1[2];
    iVar14 = iVar14 + piVar1[3];
    uVar39 = blocks_shift & 0xffffffff;
    uVar24 = uVar40 + uVar11 >> uVar39;
    uVar26 = uVar41 + uVar11 >> uVar39;
    uVar27 = uVar42 + uVar11 >> uVar39;
    uVar28 = iVar14 + uVar11 >> uVar39;
    uVar2 = *(uint *)((long)auStack_6f8 + lVar12 + 4);
    uVar3 = *(uint *)((long)auStack_6f8 + lVar12 + 8);
    uVar19 = uVar11 + *(uint *)((long)auStack_6f8 + lVar12) >> uVar39;
    uVar21 = uVar11 + uVar2 >> uVar39;
    uVar22 = uVar11 + uVar3 >> uVar39;
    uVar23 = uVar11 + *(int *)((long)auStack_6f8 + lVar12 + 0xc) >> uVar39;
    auVar29._0_4_ =
         ((float)(uVar19 & 0x7fffffff) + (float)((int)uVar19 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar12) +
         ((float)(uVar24 & 0x7fffffff) + (float)((int)uVar24 >> 0x1f & 0x4f000000)) *
         ((auVar20._0_4_ - auVar18._0_4_) * (fVar34 + fVar35) + fVar35 * fVar34);
    auVar29._4_4_ =
         ((float)(uVar21 & 0x7fffffff) + (float)((int)uVar21 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar12 + 4) +
         ((float)(uVar26 & 0x7fffffff) + (float)((int)uVar26 >> 0x1f & 0x4f000000)) *
         ((auVar17._0_4_ - local_288._0_4_) * (fVar36 + fVar37) + fVar37 * fVar36);
    auVar29._8_4_ =
         ((float)(uVar22 & 0x7fffffff) + (float)((int)uVar22 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar12 + 8) +
         ((float)(uVar27 & 0x7fffffff) + (float)((int)uVar27 >> 0x1f & 0x4f000000)) *
         (fVar43 * (fVar45 + fVar44) + fVar44 * fVar45);
    auVar29._12_4_ =
         ((float)(uVar23 & 0x7fffffff) + (float)((int)uVar23 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_7f8 + lVar12 + 0xc) +
         ((float)(uVar28 & 0x7fffffff) + (float)((int)uVar28 >> 0x1f & 0x4f000000)) *
         (fVar43 * (fVar44 + fVar45) + fVar45 * fVar44);
    uVar19 = -(uint)(local_218[0] <= auVar29._0_4_);
    uVar21 = -(uint)(local_218[1] <= auVar29._4_4_);
    uVar22 = -(uint)(local_218[2] <= auVar29._8_4_);
    local_228 = (float)((uint)local_228 & uVar19 | ~uVar19 & uVar30);
    uStack_224 = uStack_224 & uVar21 | ~uVar21 & uVar32;
    uStack_220 = uStack_220 & uVar22 | ~uVar22 & uVar33;
    auVar25._4_4_ = local_218[1];
    auVar25._0_4_ = local_218[0];
    auVar25._8_4_ = local_218[2];
    auVar25._12_4_ = uVar38;
    auVar25 = minps(auVar29,auVar25);
    aiStack_23c[1] = aiStack_23c[1] & uVar19 | ~uVar19 & uVar40;
    aiStack_23c[2] = aiStack_23c[2] & uVar21 | ~uVar21 & uVar41;
    aiStack_23c[3] = aiStack_23c[3] & uVar22 | ~uVar22 & uVar42;
    local_248[0] = local_248[0] & uVar19 | ~uVar19 & *(uint *)((long)auStack_6f8 + lVar12);
    local_248[1] = local_248[1] & uVar21 | ~uVar21 & uVar2;
    local_248[2] = local_248[2] & uVar22 | ~uVar22 & uVar3;
    uVar30 = uVar30 + 1;
    uVar32 = uVar32 + 1;
    uVar33 = uVar33 + 1;
    lVar12 = lVar12 + 0x10;
    local_218[0] = auVar25._0_4_;
    local_218[1] = auVar25._4_4_;
    local_218[2] = auVar25._8_4_;
    uVar38 = auVar25._12_4_;
  }
  fVar34 = 0.0;
  fVar35 = INFINITY;
  iVar14 = 0;
  iVar15 = 0;
  for (lVar10 = -3; lVar10 != 0; lVar10 = lVar10 + 1) {
    fVar36 = *(float *)((long)&(mapping->scale).field_0 + lVar10 * 4 + 0xc);
    if ((((fVar36 != 0.0) || (NAN(fVar36))) && (afStack_1f8[lVar10 + -5] < fVar35)) &&
       (local_218[lVar10 + -1] != 0.0)) {
      iVar14 = (&iStack_22c)[lVar10];
      iVar15 = aiStack_23c[lVar10];
      iVar13 = (int)lVar10 + 3;
      fVar34 = local_218[lVar10 + -1];
      fVar35 = afStack_1f8[lVar10 + -5];
    }
  }
  if (iVar13 == -1) {
    iVar14 = -1;
    fVar34 = 0.0;
    fVar35 = INFINITY;
    iVar15 = iVar14;
  }
  uVar4 = *(undefined8 *)&(mapping->ofs).field_0;
  uVar5 = *(undefined8 *)((long)&(mapping->ofs).field_0 + 8);
  uVar6 = *(undefined8 *)&(mapping->scale).field_0;
  uVar7 = *(undefined8 *)((long)&(mapping->scale).field_0 + 8);
  uVar8 = *(undefined8 *)&(mapping->inv_scale).field_0;
  uVar9 = *(undefined8 *)((long)&(mapping->inv_scale).field_0 + 8);
  __return_storage_ptr__->sah = fVar35;
  __return_storage_ptr__->dim = iVar13;
  __return_storage_ptr__->pos = (int)fVar34;
  __return_storage_ptr__->left = iVar14;
  __return_storage_ptr__->right = iVar15;
  __return_storage_ptr__->factor = 1.0;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar4;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar5;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = uVar6;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uVar7;
  *(undefined8 *)&(__return_storage_ptr__->mapping).inv_scale.field_0 = uVar8;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).inv_scale.field_0 + 8) = uVar9;
  return __return_storage_ptr__;
}

Assistant:

SpatialBinSplit<BINS> best(const SpatialBinMapping<BINS>& mapping, const size_t blocks_shift) const 
      {
        /* sweep from right to left and compute parallel prefix of merged bounds */
        vfloat4 rAreas[BINS];
        vuint4 rCounts[BINS];
        vuint4 count = 0; BBox3fa bx = empty; BBox3fa by = empty; BBox3fa bz = empty;
        for (size_t i=BINS-1; i>0; i--)
        {
          count += numEnd[i];
          rCounts[i] = count;
          bx.extend(bounds[i][0]); rAreas[i][0] = halfArea(bx);
          by.extend(bounds[i][1]); rAreas[i][1] = halfArea(by);
          bz.extend(bounds[i][2]); rAreas[i][2] = halfArea(bz);
          rAreas[i][3] = 0.0f;
        }
        
        /* sweep from left to right and compute SAH */
        vuint4 blocks_add = (1 << blocks_shift)-1;
        vuint4 ii = 1; vfloat4 vbestSAH = pos_inf; vuint4 vbestPos = 0; vuint4 vbestlCount = 0; vuint4 vbestrCount = 0;
        count = 0; bx = empty; by = empty; bz = empty;
        for (size_t i=1; i<BINS; i++, ii+=1)
        {
          count += numBegin[i-1];
          bx.extend(bounds[i-1][0]); float Ax = halfArea(bx);
          by.extend(bounds[i-1][1]); float Ay = halfArea(by);
          bz.extend(bounds[i-1][2]); float Az = halfArea(bz);
          const vfloat4 lArea = vfloat4(Ax,Ay,Az,Az);
          const vfloat4 rArea = rAreas[i];
          const vuint4 lCount = (count     +blocks_add) >> (unsigned int)(blocks_shift);
          const vuint4 rCount = (rCounts[i]+blocks_add) >> (unsigned int)(blocks_shift);
          const vfloat4 sah = madd(lArea,vfloat4(lCount),rArea*vfloat4(rCount));
          // const vfloat4 sah = madd(lArea,vfloat4(vint4(lCount)),rArea*vfloat4(vint4(rCount)));
          const vbool4 mask = sah < vbestSAH;
          vbestPos      = select(mask,ii ,vbestPos);
          vbestSAH      = select(mask,sah,vbestSAH);
          vbestlCount   = select(mask,count,vbestlCount);
          vbestrCount   = select(mask,rCounts[i],vbestrCount);
        }
        
        /* find best dimension */
        float bestSAH = inf;
        int   bestDim = -1;
        int   bestPos = 0;
        unsigned int   bestlCount = 0;
        unsigned int   bestrCount = 0;
        for (int dim=0; dim<3; dim++) 
        {
          /* ignore zero sized dimensions */
          if (unlikely(mapping.invalid(dim)))
            continue;
          
          /* test if this is a better dimension */
          if (vbestSAH[dim] < bestSAH && vbestPos[dim] != 0) {
            bestDim = dim;
            bestPos = vbestPos[dim];
            bestSAH = vbestSAH[dim];
            bestlCount = vbestlCount[dim];
            bestrCount = vbestrCount[dim];
          }
        }
        assert(bestSAH >= 0.0f);
        
        /* return invalid split if no split found */
        if (bestDim == -1) 
          return SpatialBinSplit<BINS>(inf,-1,0,mapping);
        
        /* return best found split */
        return SpatialBinSplit<BINS>(bestSAH,bestDim,bestPos,bestlCount,bestrCount,1.0f,mapping);
      }